

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O3

optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ImprovesFeerateDiagram_abi_cxx11_
            (optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,CTxMemPool *pool,setEntries *direct_conflicts,
            setEntries *all_conflicts,CAmount replacement_fees,int64_t replacement_vsize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pFVar3;
  pointer pFVar4;
  pointer pFVar5;
  size_type sVar6;
  partial_ordering pVar7;
  T *pTVar8;
  Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
  *result;
  long in_FS_OFFSET;
  Span<const_FeeFrac> chunks0;
  Span<const_FeeFrac> chunks1;
  Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
  chunk_results;
  bilingual_str local_d0;
  undefined4 local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  undefined8 local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Variant_storage<false,_bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
  local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CTxMemPool::CalculateChunksForRBF
            ((Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
              *)&local_68,pool,replacement_fees,replacement_vsize,direct_conflicts,all_conflicts);
  if (local_68._M_index == '\x01') {
    pTVar8 = util::
             Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             ::value((Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
                      *)&local_68);
    pFVar3 = (pTVar8->second).super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar4 = (pTVar8->second).super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar8 = util::
             Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             ::value((Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
                      *)&local_68);
    pFVar5 = (pTVar8->first).super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start;
    chunks1.m_size =
         (long)(pTVar8->first).super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pFVar5 >> 4;
    chunks0.m_size = (long)pFVar4 - (long)pFVar3 >> 4;
    chunks0.m_data = pFVar3;
    chunks1.m_data = pFVar5;
    pVar7 = CompareChunks(chunks0,chunks1);
    if (pVar7._M_value == '\x01') {
      (__return_storage_ptr__->
      super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_engaged = false;
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_payload._M_value.first = FAILURE;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &(__return_storage_ptr__->
                  super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_payload._M_value.second,
                 "insufficient feerate: does not improve feerate diagram",
                 (allocator<char> *)&local_d0);
      (__return_storage_ptr__->
      super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_engaged = true;
    }
  }
  else {
    util::
    ErrorString<std::pair<std::vector<FeeFrac,std::allocator<FeeFrac>>,std::vector<FeeFrac,std::allocator<FeeFrac>>>>
              (&local_d0,(util *)&local_68,result);
    sVar6 = local_d0.original._M_string_length;
    local_88 = &local_78;
    local_90 = 0;
    paVar2 = &local_d0.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.original._M_dataplus._M_p == paVar2) {
      local_78._8_8_ = local_d0.original.field_2._8_8_;
      local_d0.original._M_dataplus._M_p = (pointer)local_88;
    }
    local_78._M_allocated_capacity._1_7_ = local_d0.original.field_2._M_allocated_capacity._1_7_;
    local_78._M_local_buf[0] = local_d0.original.field_2._M_local_buf[0];
    local_d0.original._M_string_length = 0;
    local_d0.original.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->
    super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._M_value.first = UNCALCULABLE;
    paVar1 = &(__return_storage_ptr__->
              super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_payload._M_value.second.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&(__return_storage_ptr__->
                 super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_payload + 8) = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.original._M_dataplus._M_p == local_88) {
      paVar1->_M_allocated_capacity = local_78._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_payload._M_value.second.field_2 + 8) = local_78._8_8_;
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_payload._M_value.second._M_dataplus._M_p = local_d0.original._M_dataplus._M_p;
      (__return_storage_ptr__->
      super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_payload._M_value.second.field_2._M_allocated_capacity = local_78._M_allocated_capacity;
    }
    (__return_storage_ptr__->
    super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._M_value.second._M_string_length = sVar6;
    local_80 = 0;
    local_78._M_allocated_capacity =
         (ulong)(uint7)local_d0.original.field_2._M_allocated_capacity._1_7_ << 8;
    (__return_storage_ptr__->
    super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_engaged = true;
    local_d0.original._M_dataplus._M_p = (pointer)paVar2;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_d0.translated._M_dataplus._M_p != &local_d0.translated.field_2) &&
       (operator_delete(local_d0.translated._M_dataplus._M_p,
                        local_d0.translated.field_2._M_allocated_capacity + 1),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_d0.original._M_dataplus._M_p != paVar2)) {
      operator_delete(local_d0.original._M_dataplus._M_p,
                      CONCAT71(local_d0.original.field_2._M_allocated_capacity._1_7_,
                               local_d0.original.field_2._M_local_buf[0]) + 1);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
  ::~_Variant_storage(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::pair<DiagramCheckError, std::string>> ImprovesFeerateDiagram(CTxMemPool& pool,
                                                const CTxMemPool::setEntries& direct_conflicts,
                                                const CTxMemPool::setEntries& all_conflicts,
                                                CAmount replacement_fees,
                                                int64_t replacement_vsize)
{
    // Require that the replacement strictly improves the mempool's feerate diagram.
    const auto chunk_results{pool.CalculateChunksForRBF(replacement_fees, replacement_vsize, direct_conflicts, all_conflicts)};

    if (!chunk_results.has_value()) {
        return std::make_pair(DiagramCheckError::UNCALCULABLE, util::ErrorString(chunk_results).original);
    }

    if (!std::is_gt(CompareChunks(chunk_results.value().second, chunk_results.value().first))) {
        return std::make_pair(DiagramCheckError::FAILURE, "insufficient feerate: does not improve feerate diagram");
    }
    return std::nullopt;
}